

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall
ObjectTest_basic_get_forward_list_Test::TestBody(ObjectTest_basic_get_forward_list_Test *this)

{
  long *plVar1;
  _Fwd_list_node_base *p_Var2;
  _Fwd_list_impl _Var3;
  pointer *__ptr;
  _Uninitialized<void_*,_true> _Var4;
  pointer *__ptr_1;
  AssertionResult gtest_ar_;
  object obj;
  _Fwd_list_impl local_98;
  AssertHelper local_90 [8];
  char local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [32];
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  
  local_58._M_u._0_8_ = 0;
  local_58._M_index = 0;
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_78,(forward_list<bool,_std::allocator<bool>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *(long **)local_78._0_8_;
      operator_delete((void *)local_78._0_8_,0x10);
      local_78._0_8_ = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"obj.get<std::forward_list<bool>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf6,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_78,
             (forward_list<signed_char,_std::allocator<signed_char>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "obj.get<std::forward_list<signed char>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf7,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_78,
             (forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "obj.get<std::forward_list<unsigned char>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf8,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_78,(forward_list<short,_std::allocator<short>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"obj.get<std::forward_list<short>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf9,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_78,(forward_list<int,_std::allocator<int>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"obj.get<std::forward_list<int>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfa,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_78,(forward_list<long,_std::allocator<long>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"obj.get<std::forward_list<long>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfb,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_78,
             (forward_list<long_long,_std::allocator<long_long>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "obj.get<std::forward_list<long long>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfc,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_78,(forward_list<long,_std::allocator<long>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"obj.get<std::forward_list<intmax_t>>().empty()"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfd,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_78,(forward_list<float,_std::allocator<float>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"obj.get<std::forward_list<float>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfe,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_78,(forward_list<double,_std::allocator<double>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x10);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x10);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"obj.get<std::forward_list<double>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xff,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_78,
             (forward_list<long_double,_std::allocator<long_double>_> *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var4._M_storage = (void *)local_78._0_8_;
  if (!(bool)local_88[0]) {
    do {
      plVar1 = *_Var4._M_storage;
      operator_delete(_Var4._M_storage,0x20);
      _Var4._M_storage = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  local_78._0_8_ = (void *)0x0;
  _Var3._M_head._M_next = local_98._M_head._M_next;
  while (_Var3._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var2 = ((_Fwd_list_node_base *)_Var3._M_head._M_next)->_M_next;
    operator_delete((void *)_Var3._M_head._M_next,0x20);
    _Var3._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var2;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "obj.get<std::forward_list<long double>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x100,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_78,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)(local_78 + 0x20));
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)local_78);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)&local_98);
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,
               "obj.get<std::forward_list<std::u8string>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x101,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_78,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)(local_78 + 0x20))
  ;
  local_88[0] = (void *)local_78._0_8_ == (void *)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)local_78);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_78,local_88,"obj.get<std::forward_list<object>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x102,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)(local_78 + 0x20));
  return;
}

Assistant:

TEST(ObjectTest, basic_get_forward_list) {
	object obj;

	EXPECT_TRUE(obj.get<std::forward_list<bool>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<short>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<int>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long long>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<float>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<double>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long double>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<object>>().empty());
}